

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benckmark.cpp
# Opt level: O1

void Option::printDefautOption(void)

{
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  
  puts("Defaut Option : ");
  puts(
      "\thost               = 127.0.0.1\n\ttimeout_ms         = 3000\n\tserver_port        = 9000\n\tconcurrent_num     = 1024\n\tis_keep_alive      = true\n\tduration           = 0\n\tthread_num         = 1"
      );
  printf("Usage: %s \n\t  [-h host] \n\t  [-p source_port] \n\t  [-c concurrent_num] \n\t  [-t thread_num] \n\t  [-a is_keep_alive] \n\t  [-d duration] \n\t  [-w timeout] \n"
         ,"benchmark",extraout_RDX,in_RAX);
  return;
}

Assistant:

void Option::printDefautOption()
{

    printf("Defaut Option : \n");
    printf("\thost               = 127.0.0.1\n"
            "\ttimeout_ms         = 3000\n"
            "\tserver_port        = 9000\n"
            "\tconcurrent_num     = 1024\n"
            "\tis_keep_alive      = true\n"
            "\tduration           = 0\n"
            "\tthread_num         = 1\n");
    printf("Usage: %s \n"
            "\t  [-h host] \n"
            "\t  [-p source_port] \n"
            "\t  [-c concurrent_num] \n"
            "\t  [-t thread_num] \n"
            "\t  [-a is_keep_alive] \n"
            //测试持续时间
            "\t  [-d duration] \n"
            "\t  [-w timeout] \n", "benchmark");
}